

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O2

void test_empty_simplex_tree<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
               (Simplex_tree<Gudhi::Simplex_tree_options_default> *tst)

{
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this;
  int iVar1;
  size_t sVar2;
  undefined1 local_260 [8];
  undefined8 local_258;
  shared_count sStack_250;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  undefined **local_230;
  undefined1 local_228;
  undefined8 *local_220;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *local_218;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *local_210;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2c);
  local_260[0] = tst->null_vertex_ == -1;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_218 = &local_248;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c511;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c53a;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x2d);
  local_260[0] = (tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c53b;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c55b;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = &local_248;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion(local_260,&local_230,&local_90,0x2d,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2e);
  sVar2 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(tst);
  local_260[0] = sVar2 == 0;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c55c;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c57d;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = &local_248;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion(local_260,&local_230,&local_c0,0x2e,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2f);
  local_260[0] = (tst->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c57e;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c58c;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = &local_248;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_e8 = "";
  boost::test_tools::tt_detail::report_assertion(local_260,&local_230,&local_f0,0x2f,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x30);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_248,tst);
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260[0] = std::operator==((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_248
                                 ,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_208);
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_218 = (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_120;
  local_120 = "tst.num_simplices_by_dimension() == std::vector<size_t>()";
  local_118 = "";
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_128 = "";
  local_210 = tst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_250);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_208);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_248);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x32);
  local_260[0] = 1;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c5c7;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c5d8;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_158 = "";
  local_218 = &local_248;
  boost::test_tools::tt_detail::report_assertion(local_260,&local_230,&local_160,0x32,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x33);
  this = local_210;
  local_260[0] = (local_210->root_).oncles_ ==
                 (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                  *)0x0;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c5d9;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c5f4;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = &local_248;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_188 = "";
  boost::test_tools::tt_detail::report_assertion(local_260,&local_230,&local_190,0x33,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x34);
  local_260[0] = (this->root_).parent_ == -1;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c5f5;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c61d;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = &local_248;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1b8 = "";
  boost::test_tools::tt_detail::report_assertion(local_260,&local_230,&local_1c0,0x34,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_250);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x35);
  iVar1 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(this);
  local_260[0] = iVar1 == -1;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x17c61e;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x17c633;
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_001c1f38;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = &local_248;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion(local_260,&local_230,&local_1f0,0x35,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_250);
  return;
}

Assistant:

void test_empty_simplex_tree(const typeST& tst) {
  typedef typename typeST::Vertex_handle Vertex_handle;
  const Vertex_handle DEFAULT_VERTEX_VALUE = Vertex_handle(- 1);
  BOOST_CHECK(tst.null_vertex() == DEFAULT_VERTEX_VALUE);
  BOOST_CHECK(tst.num_vertices() == (size_t) 0);
  BOOST_CHECK(tst.num_simplices() == (size_t) 0);
  BOOST_CHECK(tst.is_empty());
  BOOST_CHECK(tst.num_simplices_by_dimension() == std::vector<size_t>());
  const typename typeST::Siblings* STRoot = tst.root();
  BOOST_CHECK(STRoot != nullptr);
  BOOST_CHECK(STRoot->oncles() == nullptr);
  BOOST_CHECK(STRoot->parent() == DEFAULT_VERTEX_VALUE);
  BOOST_CHECK(tst.dimension() == -1);
}